

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCodes.h
# Opt level: O3

void jbcoin::RPC::inject_error<Json::Value>(error_code_i code,string *message,Value *json)

{
  ErrorInfo *pEVar1;
  ValueHolder VVar2;
  ValueHolder *pVVar3;
  ValueHolder VVar4;
  ValueHolder local_30;
  ushort local_28;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  pEVar1 = get_error_info(code);
  local_28 = 0x104;
  Json::valueAllocator();
  VVar2._0_4_ = (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                          (Json::valueAllocator::valueAllocator,(pEVar1->token)._M_dataplus._M_p,
                           (ulong)(uint)(pEVar1->token)._M_string_length);
  VVar2._4_4_ = extraout_var;
  local_30 = VVar2;
  pVVar3 = &Json::Value::resolveReference(json,"error",true)->value_;
  local_30 = *pVVar3;
  *pVVar3 = VVar2;
  local_28 = *(ushort *)(pVVar3 + 1);
  *(ushort *)(pVVar3 + 1) = local_28 & 0xfe00 | 0x104;
  local_28 = local_28 & 0x1ff;
  Json::Value::~Value((Value *)&local_30);
  local_28 = 1;
  local_30.int_ = pEVar1->code;
  pVVar3 = &Json::Value::resolveReference(json,"error_code",true)->value_;
  VVar2 = *pVVar3;
  *pVVar3 = local_30;
  local_28 = *(ushort *)(pVVar3 + 1);
  *(ushort *)(pVVar3 + 1) = (local_28 & 0xfe00) + 1;
  local_28 = local_28 & 0x1ff;
  local_30 = VVar2;
  Json::Value::~Value((Value *)&local_30);
  local_28 = 0x104;
  Json::valueAllocator();
  VVar4._0_4_ = (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                          (Json::valueAllocator::valueAllocator,(message->_M_dataplus)._M_p,
                           (ulong)(uint)message->_M_string_length);
  VVar4._4_4_ = extraout_var_00;
  local_30 = VVar4;
  pVVar3 = &Json::Value::resolveReference(json,"error_message",true)->value_;
  local_30 = *pVVar3;
  *pVVar3 = VVar4;
  local_28 = *(ushort *)(pVVar3 + 1);
  *(ushort *)(pVVar3 + 1) = local_28 & 0xfe00 | 0x104;
  local_28 = local_28 & 0x1ff;
  Json::Value::~Value((Value *)&local_30);
  return;
}

Assistant:

void inject_error (
    error_code_i code, std::string const& message, JsonValue& json)
{
    ErrorInfo const& info (get_error_info (code));
    json [jss::error] = info.token;
    json [jss::error_code] = info.code;
    json [jss::error_message] = message;
}